

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

void Cec_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  long lVar5;
  
  while ((((((ulong)pObj & 1) == 0 && ((~*(uint *)pObj & 0x9fffffff) != 0)) &&
          ((fFirst != 0 || ((int)pObj->Value < 2)))) &&
         ((fUseMuxes == 0 || (iVar3 = Gia_ObjIsMuxType(pObj), iVar3 == 0))))) {
    fFirst = 0;
    Cec_CollectSuper_rec
              ((Gia_Obj_t *)
               ((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) |
               (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))),vSuper,0,fUseMuxes);
    pObj = (Gia_Obj_t *)
           ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) |
           (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
  }
  uVar1 = vSuper->nSize;
  if (0 < (long)(int)uVar1) {
    lVar5 = 0;
    do {
      if ((Gia_Obj_t *)vSuper->pArray[lVar5] == pObj) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  uVar2 = vSuper->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar4;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) goto LAB_0064f8ff;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar4;
    }
    vSuper->nCap = iVar3;
  }
LAB_0064f8ff:
  iVar3 = vSuper->nSize;
  vSuper->nSize = iVar3 + 1;
  vSuper->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Cec_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && Gia_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}